

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O3

void __thiscall
SquareMatrix_Basics3_Test::~SquareMatrix_Basics3_Test(SquareMatrix_Basics3_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SquareMatrix, Basics3) {
    SquareMatrix<3> m3;
    EXPECT_TRUE(m3.IsIdentity());

    EXPECT_EQ(m3, SquareMatrix<3>(1, 0, 0, 0, 1, 0, 0, 0, 1));
    EXPECT_NE(m3, SquareMatrix<3>(0, 1, 0, 0, 1, 0, 0, 0, 1));

    EXPECT_EQ(SquareMatrix<3>(2, 0, 0, 0, -1, 0, 0, 0, 3),
              SquareMatrix<3>::Diag(2, -1, 3));

    SquareMatrix<3> m(1, 2, 3, 4, 5, 6, 7, 8, 9);
    EXPECT_FALSE(m.IsIdentity());
    SquareMatrix<3> mt(1, 4, 7, 2, 5, 8, 3, 6, 9);
    EXPECT_EQ(Transpose(m), mt);

    pstd::array<Float, 3> v{1, -2, 4};
    pstd::array<Float, 3> vt = m * v;
    EXPECT_EQ(1 - 4 + 12, vt[0]);
    EXPECT_EQ(4 - 10 + 24, vt[1]);
    EXPECT_EQ(7 - 16 + 36, vt[2]);

    Vector3f v3(1, -2, 4);
    Vector3f v3t = m * v3;
    EXPECT_EQ(1 - 4 + 12, v3t[0]);
    EXPECT_EQ(4 - 10 + 24, v3t[1]);
    EXPECT_EQ(7 - 16 + 36, v3t[2]);

    pstd::optional<SquareMatrix<3>> inv = Inverse(m3);
    EXPECT_TRUE(inv.has_value());
    EXPECT_EQ(m3, *inv);

    SquareMatrix<3> ms(2, 0, 0, 0, 4, 0, 0, 0, -1);
    inv = Inverse(ms);
    EXPECT_TRUE(inv.has_value());
    EXPECT_EQ(SquareMatrix<3>(0.5, 0, 0, 0, .25, 0, 0, 0, -1), *inv);

    SquareMatrix<3> degen(0, 0, 2, 0, 0, 0, 1, 1, 1);
    inv = Inverse(degen);
    EXPECT_FALSE(inv.has_value());
}